

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_loo_norm
          (default_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  longdouble *plVar2;
  long lVar3;
  long local_28;
  ushort uStack_20;
  
  plVar2 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  plVar2 = std::__max_element<long_double*,__gnu_cxx::__ops::_Iter_less_iter>(plVar2,plVar2 + n);
  lVar1 = *plVar2;
  local_28 = SUB108(lVar1,0);
  uStack_20 = (ushort)((unkuint10)lVar1 >> 0x40);
  if ((ushort)((uStack_20 & 0x7fff) - 1) < 0x7ffe && local_28 < 0) {
    plVar2 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    for (lVar3 = 0; (ulong)(uint)n << 4 != lVar3; lVar3 = lVar3 + 0x10) {
      *(longdouble *)((long)plVar2 + lVar3) = *(longdouble *)((long)plVar2 + lVar3) / lVar1;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }